

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void slist_data(Symbol *s,int indx,int findx)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  
  if (s->slist_info_ == (int *)0x0) {
    piVar4 = (int *)emalloc(0xc);
    s->slist_info_ = piVar4;
    *piVar4 = 1;
    piVar4[1] = findx;
    piVar4 = piVar4 + 2;
  }
  else {
    iVar1 = *s->slist_info_;
    piVar2 = (int *)emalloc(iVar1 * 8 + 0xc);
    piVar4 = s->slist_info_;
    for (uVar3 = (ulong)(uint)(iVar1 * 2); 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      piVar2[uVar3] = piVar4[uVar3];
    }
    free(piVar4);
    s->slist_info_ = piVar2;
    *piVar2 = iVar1 + 1;
    lVar5 = (long)((iVar1 + 1) * 2);
    piVar4 = piVar2 + lVar5;
    piVar2[lVar5 + -1] = findx;
  }
  *piVar4 = indx;
  return;
}

Assistant:

void slist_data(s, indx, findx) Symbol* s; int indx, findx; {
	/* format: number of pairs, followed by findx, indx pairs */
	int* pi;
	int i, n;
	if (s->slist_info_) {
		/* i'd use realloc but to avoid portability problems */
		/* this probably will never get executed anyway */
		n = s->slist_info_[0] + 1;
		pi = (int*)emalloc((1 + 2*n)*sizeof(int));
		for (i=2*(n-1); i > 0; --i) {
			pi[i] = s->slist_info_[i];
		}
		free(s->slist_info_);
		s->slist_info_ = pi;
		pi[0] = n;
		pi[2*n-1] = findx;
		pi[2*n] = indx;
	}else{
		s->slist_info_ = pi = (int*)emalloc(3*sizeof(int));
		pi[0] = 1;
		pi[1] = findx;
		pi[2] = indx;
	}
}